

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int io_file_iter(lua_State *L)

{
  uint need;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  IOFileUD *iof_00;
  int n;
  IOFileUD *iof;
  GCfunc *fn;
  lua_State *L_local;
  
  uVar2 = L->base[-2].u64 & 0x7fffffffffff;
  uVar3 = *(ulong *)(uVar2 + 0x30) & 0x7fffffffffff;
  iof_00 = (IOFileUD *)(uVar3 + 0x30);
  need = *(byte *)(uVar2 + 0xb) - 1;
  if (iof_00->fp == (FILE *)0x0) {
    lj_err_caller(L,LJ_ERR_IOCLFL);
  }
  L->top = L->base;
  if (need != 0) {
    if ((long)((L->maxstack).ptr64 - (long)L->top) <= (long)((ulong)need * 8)) {
      lj_state_growstack(L,need);
    }
    memcpy(L->top,(void *)(uVar2 + 0x38),(long)(int)need << 3);
    L->top = L->top + (int)need;
  }
  L_local._0_4_ = io_file_read(L,iof_00,0);
  iVar1 = ferror((FILE *)iof_00->fp);
  if (iVar1 == 0) {
    if ((L->base->u64 == 0xffffffffffffffff) && ((*(uint *)(uVar3 + 0x38) & 4) != 0)) {
      io_file_close(L,iof_00);
      L_local._0_4_ = 0;
    }
    return (int)L_local;
  }
  lj_err_callermsg(L,(char *)((L->top[-2].u64 & 0x7fffffffffff) + 0x18));
}

Assistant:

static int io_file_iter(lua_State *L)
{
  GCfunc *fn = curr_func(L);
  IOFileUD *iof = uddata(udataV(&fn->c.upvalue[0]));
  int n = fn->c.nupvalues - 1;
  if (iof->fp == NULL)
    lj_err_caller(L, LJ_ERR_IOCLFL);
  L->top = L->base;
  if (n) {  /* Copy upvalues with options to stack. */
    lj_state_checkstack(L, (MSize)n);
    memcpy(L->top, &fn->c.upvalue[1], n*sizeof(TValue));
    L->top += n;
  }
  n = io_file_read(L, iof, 0);
  if (ferror(iof->fp))
    lj_err_callermsg(L, strVdata(L->top-2));
  if (tvisnil(L->base) && (iof->type & IOFILE_FLAG_CLOSE)) {
    io_file_close(L, iof);  /* Return values are ignored. */
    return 0;
  }
  return n;
}